

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O1

void ts_subtree_set_children
               (MutableSubtree self,Subtree *children,uint32_t child_count,TSLanguage *language)

{
  int32_t *piVar1;
  uint32_t *puVar2;
  ushort uVar3;
  uint uVar4;
  undefined4 uVar5;
  Subtree *__ptr;
  SubtreeHeapData *pSVar6;
  uint uVar8;
  undefined4 uVar9;
  SubtreeHeapData *pSVar7;
  uint uVar10;
  TSSymbol *pTVar11;
  byte bVar12;
  uint uVar13;
  ushort uVar14;
  TSStateId TVar15;
  ulong uVar16;
  char cVar17;
  int32_t iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  bool bVar26;
  Length result;
  int iStack_6c;
  uint32_t uStack_68;
  undefined4 uStack_4c;
  
  if (((ulong)self.ptr & 1) != 0) {
    __assert_fail("!self.data.is_inline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.c"
                  ,0x15b,
                  "void ts_subtree_set_children(MutableSubtree, Subtree *, uint32_t, const TSLanguage *)"
                 );
  }
  if (((self.ptr)->child_count != 0) &&
     (__ptr = ((self.ptr)->field_17).field_0.children, __ptr != children)) {
    free(__ptr);
  }
  (self.ptr)->child_count = child_count;
  ((self.ptr)->field_17).field_0.children = children;
  *(undefined8 *)((long)&(self.ptr)->field_17 + 8) = 0;
  uVar4 = 0;
  (self.ptr)->error_cost = 0;
  *(undefined8 *)((long)&(self.ptr)->field_17 + 0x10) = 1;
  (self.ptr)->field_0x2c = (self.ptr)->field_0x2c & 0xbf;
  ((self.ptr)->field_17).field_0.dynamic_precedence = 0;
  TVar15 = TS_TREE_STATE_NONE;
  uVar16 = (ulong)((self.ptr)->field_17).field_0.alias_sequence_id;
  if (uVar16 == 0) {
    pTVar11 = (TSSymbol *)0x0;
  }
  else {
    pTVar11 = language->alias_sequences + language->max_alias_sequence_length * uVar16;
  }
  if (child_count != 0) {
    uVar16 = 0;
    uVar23 = 0;
    uVar13 = 0;
    do {
      pSVar6 = children[uVar16].ptr;
      uVar4 = (uint)((ulong)pSVar6 >> 0x10);
      uVar10 = (uint)((ulong)pSVar6 >> 0x20);
      if (uVar16 == 0) {
        if (((ulong)pSVar6 & 1) == 0) {
          uVar21._0_4_ = (pSVar6->padding).bytes;
          uVar21._4_4_ = (pSVar6->padding).extent.row;
          uVar20 = uVar21 & 0xffffffff;
          uVar21 = uVar21 >> 0x20;
          uVar24 = (pSVar6->padding).extent.column;
        }
        else {
          uVar20 = (ulong)(uVar4 & 0xff);
          uVar21 = (ulong)(uVar10 >> 8 & 0xf);
          uVar24 = uVar10 & 0xff;
        }
        uVar20 = uVar21 << 0x20 | uVar20;
        ((Length *)((long)self + 4))->bytes = (int)uVar20;
        (((Length *)((long)self + 4))->extent).row = (int)(uVar20 >> 0x20);
        ((self.ptr)->padding).extent.column = uVar24;
        if (((ulong)pSVar6 & 1) == 0) {
          uVar20._0_4_ = (pSVar6->size).bytes;
          uVar20._4_4_ = (pSVar6->size).extent.row;
          uVar21 = uVar20 & 0xffffffff00000000;
          uVar24 = (pSVar6->size).extent.column;
        }
        else {
          uVar20 = (ulong)pSVar6 >> 0x18 & 0xff;
          uVar24 = (uint32_t)uVar20;
          uVar21 = 0;
        }
        uVar21 = uVar20 & 0xffffffff | uVar21;
        ((Length *)((long)self + 0x10))->bytes = (int)uVar21;
        (((Length *)((long)self + 0x10))->extent).row = (int)(uVar21 >> 0x20);
        ((self.ptr)->size).extent.column = uVar24;
      }
      else {
        if (((ulong)pSVar6 & 1) == 0) {
          uVar4 = (pSVar6->padding).bytes;
          uVar8 = (pSVar6->padding).extent.row;
          uVar24 = (pSVar6->padding).extent.column;
        }
        else {
          uVar4 = uVar4 & 0xff;
          uVar8 = uVar10 >> 8 & 0xf;
          uVar24 = uVar10 & 0xff;
        }
        if (((ulong)pSVar6 & 1) == 0) {
          uVar19._0_4_ = (pSVar6->size).bytes;
          uVar19._4_4_ = (pSVar6->size).extent.row;
          uVar25 = (pSVar6->size).extent.column;
          iVar22 = uVar19._4_4_;
        }
        else {
          uVar19 = (ulong)pSVar6 >> 0x18 & 0xff;
          uVar25 = (uint32_t)uVar19;
          iVar22 = 0;
        }
        uVar20 = CONCAT44(uVar24,uVar8) + CONCAT44(uVar25,iVar22);
        uVar21 = uVar20 & 0xffffffff | (ulong)uVar25 << 0x20;
        if (iVar22 == 0) {
          uVar21 = uVar20;
        }
        iStack_6c = (int)uVar21;
        uVar5 = ((Length *)((long)self + 0x10))->bytes;
        uVar9 = (((Length *)((long)self + 0x10))->extent).row;
        uVar20 = CONCAT44(((self.ptr)->size).extent.column,uVar9) + uVar21;
        uVar21 = uVar20 & 0xffffffff | uVar21 & 0xffffffff00000000;
        if (iStack_6c == 0) {
          uVar21 = uVar20;
        }
        iStack_6c = (int)uVar21;
        uStack_68 = (uint32_t)(uVar21 >> 0x20);
        ((Length *)((long)self + 0x10))->bytes = (int)uVar19 + uVar4 + uVar5;
        (((Length *)((long)self + 0x10))->extent).row = iStack_6c;
        ((self.ptr)->size).extent.column = uStack_68;
      }
      if (((ulong)pSVar6 & 1) == 0) {
        uVar4 = pSVar6->lookahead_bytes;
      }
      else {
        uVar4 = uVar10 >> 0xc & 0xf;
      }
      uVar4 = ((self.ptr)->size).bytes + ((self.ptr)->padding).bytes + uVar4;
      if (uVar4 <= uVar13) {
        uVar4 = uVar13;
      }
      if (((ulong)pSVar6 & 1) == 0) {
        if (pSVar6->symbol != 0xfffe) {
          if (((ulong)pSVar6 & 1) != 0) goto LAB_001324ec;
          uVar13 = *(uint *)&pSVar6->field_0x2c >> 7;
          goto LAB_001324f2;
        }
      }
      else {
LAB_001324ec:
        uVar13 = (uint)((ulong)pSVar6 >> 5) & 0x7ffffff;
LAB_001324f2:
        uVar13 = uVar13 & 1;
        cVar17 = (char)uVar13;
        if (uVar13 != 0) {
          uVar13 = 0x262;
        }
        if (cVar17 == '\0' && ((ulong)pSVar6 & 1) == 0) {
          uVar13 = pSVar6->error_cost;
        }
        (self.ptr)->error_cost = (self.ptr)->error_cost + uVar13;
      }
      uVar24 = 1;
      if (((ulong)pSVar6 & 1) == 0) {
        if (pSVar6->child_count == 0) {
          iVar18 = 0;
        }
        else {
          iVar18 = (pSVar6->field_17).field_0.dynamic_precedence;
        }
        piVar1 = &((self.ptr)->field_17).field_0.dynamic_precedence;
        *piVar1 = *piVar1 + iVar18;
        if ((((ulong)pSVar6 & 1) == 0) && (pSVar6->child_count != 0)) {
          uVar24 = (pSVar6->field_17).field_0.node_count;
        }
      }
      puVar2 = &((self.ptr)->field_17).field_0.node_count;
      *puVar2 = *puVar2 + uVar24;
      if ((pTVar11 == (TSSymbol *)0x0) || (pTVar11[uVar23] == 0)) {
LAB_00132593:
        if (((ulong)pSVar6 & 1) == 0) {
          uVar13 = (uint)*(ushort *)&pSVar6->field_0x2c;
        }
        else {
          uVar13 = (uint)((ulong)pSVar6 >> 1) & 0x7fffffff;
        }
        if ((uVar13 & 1) != 0) {
          puVar2 = &((self.ptr)->field_17).field_0.visible_child_count;
          *puVar2 = *puVar2 + 1;
          if (((ulong)pSVar6 & 1) == 0) {
            uVar13 = *(uint *)&pSVar6->field_0x2c >> 1;
          }
          else {
            uVar13 = (uint)((ulong)pSVar6 >> 2) & 0x3fffffff;
          }
          uVar24 = 1;
          if ((uVar13 & 1) != 0) {
LAB_001325ed:
            puVar2 = &((self.ptr)->field_17).field_0.named_child_count;
            *puVar2 = *puVar2 + uVar24;
          }
          goto LAB_001325f0;
        }
        if (((ulong)pSVar6 & 1) == 0) {
          if (pSVar6->child_count != 0) {
            puVar2 = &((self.ptr)->field_17).field_0.visible_child_count;
            *puVar2 = *puVar2 + (pSVar6->field_17).field_0.visible_child_count;
            uVar24 = (pSVar6->field_17).field_0.named_child_count;
            goto LAB_001325ed;
          }
          goto LAB_001325f0;
        }
LAB_00132622:
        uVar13 = (uint)pSVar6 >> 3;
      }
      else {
        if (((ulong)pSVar6 & 1) == 0) {
          uVar13 = *(uint *)&pSVar6->field_0x2c >> 2;
        }
        else {
          uVar13 = (uint)((ulong)pSVar6 >> 3) & 0x1fffffff;
        }
        if ((uVar13 & 1) != 0) goto LAB_00132593;
        puVar2 = &((self.ptr)->field_17).field_0.visible_child_count;
        *puVar2 = *puVar2 + 1;
        uVar3 = pTVar11[uVar23];
        if ((uVar3 != 0xfffe) &&
           ((uVar24 = 1, uVar3 == 0xffff || (((byte)language->symbol_metadata[uVar3] & 2) != 0))))
        goto LAB_001325ed;
LAB_001325f0:
        if (((ulong)pSVar6 & 1) != 0) goto LAB_00132622;
        if ((pSVar6->field_0x2c & 0x40) != 0) {
          (self.ptr)->field_0x2c = (self.ptr)->field_0x2c | 0x40;
        }
        if (((ulong)pSVar6 & 1) != 0) goto LAB_00132622;
        if (pSVar6->symbol == 0xffff) {
          (self.ptr)->field_0x2c = (self.ptr)->field_0x2c | 0x18;
          (self.ptr)->parse_state = TVar15;
        }
        if (((ulong)pSVar6 & 1) != 0) goto LAB_00132622;
        uVar13 = *(uint *)&pSVar6->field_0x2c >> 2;
      }
      uVar23 = (ulong)((int)uVar23 + (uint)((uVar13 & 1) == 0));
      uVar16 = uVar16 + 1;
      uVar13 = uVar4;
    } while (child_count != uVar16);
  }
  uVar24 = ((self.ptr)->size).bytes;
  (self.ptr)->lookahead_bytes = uVar4 - (((self.ptr)->padding).bytes + uVar24);
  uVar3 = (self.ptr)->symbol;
  if (0xfffd < uVar3) {
    (self.ptr)->error_cost =
         uVar24 + ((self.ptr)->size).extent.row * 0x1e + (self.ptr)->error_cost + 500;
    if (child_count == 0) {
      return;
    }
    uVar16 = 0;
    do {
      pSVar6 = children[uVar16].ptr;
      bVar26 = true;
      if (((ulong)pSVar6 & 1) == 0) {
        bVar26 = pSVar6->child_count == 0;
      }
      if (((ulong)pSVar6 & 1) == 0) {
        uVar4 = *(uint *)&pSVar6->field_0x2c >> 2;
      }
      else {
        uVar4 = (uint)((ulong)pSVar6 >> 3) & 0x1fffffff;
      }
      if ((uVar4 & 1) == 0) {
        if (((ulong)pSVar6 & 1) == 0) {
          if ((bool)(pSVar6->symbol == 0xffff & bVar26)) goto LAB_0013273e;
          if (((ulong)pSVar6 & 1) != 0) goto LAB_0013270b;
          uVar4 = (uint)*(ushort *)&pSVar6->field_0x2c;
        }
        else {
LAB_0013270b:
          uVar4 = (uint)((ulong)pSVar6 >> 1) & 0x7fffffff;
        }
        iVar22 = 100;
        if ((uVar4 & 1) == 0) {
          if (bVar26) goto LAB_0013273e;
          iVar22 = (pSVar6->field_17).field_0.visible_child_count * 100;
        }
        (self.ptr)->error_cost = (self.ptr)->error_cost + iVar22;
      }
LAB_0013273e:
      uVar16 = uVar16 + 1;
    } while (child_count != uVar16);
  }
  if (child_count == 0) {
    return;
  }
  pSVar6 = children->ptr;
  bVar12 = (byte)((ulong)pSVar6 >> 8);
  if (((ulong)pSVar6 & 1) == 0) {
    if (pSVar6->child_count == 0) {
      uVar14 = pSVar6->symbol;
    }
    else {
      uVar14 = (pSVar6->field_17).field_0.first_leaf.symbol;
    }
  }
  else {
    uVar14 = (ushort)bVar12;
  }
  pSVar7 = children[child_count - 1].ptr;
  *(ushort *)((long)&(self.ptr)->field_17 + 0x1e) = uVar14;
  if (((ulong)pSVar6 & 1) == 0) {
    if (pSVar6->child_count == 0) {
      TVar15 = pSVar6->parse_state;
    }
    else {
      TVar15 = (pSVar6->field_17).field_0.first_leaf.parse_state;
    }
  }
  else {
    TVar15 = (TSStateId)((ulong)pSVar6 >> 0x30);
  }
  ((self.ptr)->field_17).field_0.first_leaf.parse_state = TVar15;
  if ((((ulong)pSVar6 & 1) == 0) && ((pSVar6->field_0x2c & 8) != 0)) {
    (self.ptr)->field_0x2c = (self.ptr)->field_0x2c | 8;
  }
  if ((((ulong)pSVar7 & 1) == 0) && ((pSVar7->field_0x2c & 0x10) != 0)) {
    (self.ptr)->field_0x2c = (self.ptr)->field_0x2c | 0x10;
  }
  if (child_count == 1) {
    return;
  }
  if (((*(ushort *)&(self.ptr)->field_0x2c >> 1 | *(ushort *)&(self.ptr)->field_0x2c) & 1) != 0) {
    return;
  }
  if (((ulong)pSVar6 & 1) == 0) {
    uVar14 = pSVar6->symbol;
  }
  else {
    uVar14 = (ushort)bVar12;
  }
  if (uVar14 != uVar3) {
    return;
  }
  uVar4 = 0;
  if ((((ulong)pSVar6 & 1) == 0) && (pSVar6->child_count != 0)) {
    uVar4 = (pSVar6->field_17).field_0.repeat_depth;
  }
  uVar13 = 0;
  if ((((ulong)pSVar7 & 1) == 0) && (uVar13 = 0, pSVar7->child_count != 0)) {
    uVar13 = (pSVar7->field_17).field_0.repeat_depth;
  }
  if (uVar13 < uVar4) {
    uVar24 = 1;
    if (((ulong)pSVar6 & 1) != 0) goto LAB_00132841;
    uVar25 = pSVar6->child_count;
  }
  else {
    uVar24 = 1;
    if (((ulong)pSVar7 & 1) != 0) goto LAB_00132841;
    uVar25 = pSVar7->child_count;
    pSVar6 = pSVar7;
  }
  uVar24 = 1;
  if (uVar25 != 0) {
    uVar24 = (pSVar6->field_17).field_0.repeat_depth + 1;
  }
LAB_00132841:
  ((self.ptr)->field_17).field_0.repeat_depth = uVar24;
  return;
}

Assistant:

void ts_subtree_set_children(
  MutableSubtree self, Subtree *children, uint32_t child_count, const TSLanguage *language
) {
  assert(!self.data.is_inline);

  if (self.ptr->child_count > 0 && children != self.ptr->children) {
    ts_free(self.ptr->children);
  }

  self.ptr->child_count = child_count;
  self.ptr->children = children;
  self.ptr->named_child_count = 0;
  self.ptr->visible_child_count = 0;
  self.ptr->error_cost = 0;
  self.ptr->repeat_depth = 0;
  self.ptr->node_count = 1;
  self.ptr->has_external_tokens = false;
  self.ptr->dynamic_precedence = 0;

  uint32_t non_extra_index = 0;
  const TSSymbol *alias_sequence = ts_language_alias_sequence(language, self.ptr->alias_sequence_id);
  uint32_t lookahead_end_byte = 0;

  for (uint32_t i = 0; i < self.ptr->child_count; i++) {
    Subtree child = self.ptr->children[i];

    if (i == 0) {
      self.ptr->padding = ts_subtree_padding(child);
      self.ptr->size = ts_subtree_size(child);
    } else {
      self.ptr->size = length_add(self.ptr->size, ts_subtree_total_size(child));
    }

    uint32_t child_lookahead_end_byte =
      self.ptr->padding.bytes +
      self.ptr->size.bytes +
      ts_subtree_lookahead_bytes(child);
    if (child_lookahead_end_byte > lookahead_end_byte) lookahead_end_byte = child_lookahead_end_byte;

    if (ts_subtree_symbol(child) != ts_builtin_sym_error_repeat) {
      self.ptr->error_cost += ts_subtree_error_cost(child);
    }

    self.ptr->dynamic_precedence += ts_subtree_dynamic_precedence(child);
    self.ptr->node_count += ts_subtree_node_count(child);

    if (alias_sequence && alias_sequence[non_extra_index] != 0 && !ts_subtree_extra(child)) {
      self.ptr->visible_child_count++;
      if (ts_language_symbol_metadata(language, alias_sequence[non_extra_index]).named) {
        self.ptr->named_child_count++;
      }
    } else if (ts_subtree_visible(child)) {
      self.ptr->visible_child_count++;
      if (ts_subtree_named(child)) self.ptr->named_child_count++;
    } else if (ts_subtree_child_count(child) > 0) {
      self.ptr->visible_child_count += child.ptr->visible_child_count;
      self.ptr->named_child_count += child.ptr->named_child_count;
    }

    if (ts_subtree_has_external_tokens(child)) self.ptr->has_external_tokens = true;

    if (ts_subtree_is_error(child)) {
      self.ptr->fragile_left = self.ptr->fragile_right = true;
      self.ptr->parse_state = TS_TREE_STATE_NONE;
    }

    if (!ts_subtree_extra(child)) non_extra_index++;
  }

  self.ptr->lookahead_bytes = lookahead_end_byte - self.ptr->size.bytes - self.ptr->padding.bytes;

  if (self.ptr->symbol == ts_builtin_sym_error || self.ptr->symbol == ts_builtin_sym_error_repeat) {
    self.ptr->error_cost +=
      ERROR_COST_PER_RECOVERY +
      ERROR_COST_PER_SKIPPED_CHAR * self.ptr->size.bytes +
      ERROR_COST_PER_SKIPPED_LINE * self.ptr->size.extent.row;
    for (uint32_t i = 0; i < self.ptr->child_count; i++) {
      Subtree child = self.ptr->children[i];
      uint32_t grandchild_count = ts_subtree_child_count(child);
      if (ts_subtree_extra(child)) continue;
      if (ts_subtree_is_error(child) && grandchild_count == 0) continue;
      if (ts_subtree_visible(child)) {
        self.ptr->error_cost += ERROR_COST_PER_SKIPPED_TREE;
      } else if (grandchild_count > 0) {
        self.ptr->error_cost += ERROR_COST_PER_SKIPPED_TREE * child.ptr->visible_child_count;
      }
    }
  }

  if (self.ptr->child_count > 0) {
    Subtree first_child = self.ptr->children[0];
    Subtree last_child = self.ptr->children[self.ptr->child_count - 1];

    self.ptr->first_leaf.symbol = ts_subtree_leaf_symbol(first_child);
    self.ptr->first_leaf.parse_state = ts_subtree_leaf_parse_state(first_child);

    if (ts_subtree_fragile_left(first_child)) self.ptr->fragile_left = true;
    if (ts_subtree_fragile_right(last_child)) self.ptr->fragile_right = true;

    if (
      self.ptr->child_count >= 2 &&
      !self.ptr->visible &&
      !self.ptr->named &&
      ts_subtree_symbol(first_child) == self.ptr->symbol
    ) {
      if (ts_subtree_repeat_depth(first_child) > ts_subtree_repeat_depth(last_child)) {
        self.ptr->repeat_depth = ts_subtree_repeat_depth(first_child) + 1;
      } else {
        self.ptr->repeat_depth = ts_subtree_repeat_depth(last_child) + 1;
      }
    }
  }
}